

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

Gia_Man_t * Of_ManDeriveMapping(Of_Man_t *p)

{
  Jf_Par_t *pJVar1;
  Gia_Man_t *p_00;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Bit_t *p_03;
  Gia_Obj_t *pGVar4;
  uint *pCut;
  int Entry;
  uint uVar5;
  uint v;
  long lVar6;
  
  pJVar1 = p->pPars;
  if ((pJVar1->fCutMin != 0) || (p->pGia->vMapping != (Vec_Int_t *)0x0)) {
    __assert_fail("!p->pPars->fCutMin && p->pGia->vMapping == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                  ,0x6c2,"Gia_Man_t *Of_ManDeriveMapping(Of_Man_t *)");
  }
  p_01 = Vec_IntAlloc(p->pGia->nObjs + (int)pJVar1->Edge + (int)pJVar1->Area * 2);
  p_02 = (Vec_Int_t *)0x0;
  Vec_IntFill(p_01,p->pGia->nObjs,0);
  if (p->pPars->nFastEdges != 0) {
    p_02 = Vec_IntAlloc(1000);
    Vec_IntPush(p_02,0);
  }
  p_03 = Vec_BitStart(p->pGia->nObjs);
  lVar6 = 0;
  do {
    p_00 = p->pGia;
    if (p_00->nObjs <= lVar6) {
      if ((p_01->nCap != 0x10) && (p_01->nSize != p_01->nCap)) {
        __assert_fail("Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                      ,0x6e4,"Gia_Man_t *Of_ManDeriveMapping(Of_Man_t *)");
      }
      p_00->vMapping = p_01;
      p_00->vPacking = p_02;
      Vec_BitFree(p_03);
      return p->pGia;
    }
    iVar3 = (int)lVar6;
    pGVar4 = Gia_ManObj(p_00,iVar3);
    if (((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) &&
       (p->pObjs[lVar6].nRefs != 0)) {
      pGVar4 = Gia_ManObj(p->pGia,iVar3);
      iVar2 = Gia_ObjIsBuf(pGVar4);
      if (iVar2 != 0) {
        __assert_fail("!Gia_ObjIsBuf(Gia_ManObj(p->pGia,i))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                      ,0x6cf,"Gia_Man_t *Of_ManDeriveMapping(Of_Man_t *)");
      }
      pCut = (uint *)Of_ObjCutBestP(p,iVar3);
      Vec_IntWriteEntry(p_01,iVar3,p_01->nSize);
      Vec_IntPush(p_01,*pCut & 0x1f);
      for (uVar5 = 0; uVar5 < (*pCut & 0x1f); uVar5 = uVar5 + 1) {
        iVar2 = Of_CutVar((int *)pCut,uVar5);
        if (iVar2 == 0) break;
        Vec_IntPush(p_01,iVar2);
      }
      Vec_IntPush(p_01,iVar3);
      if (p_02 != (Vec_Int_t *)0x0) {
        iVar2 = Vec_BitEntry(p_03,iVar3);
        if (iVar2 == 0) {
          uVar5 = p_02->nSize;
          Vec_IntPush(p_02,0);
          Vec_IntPush(p_02,iVar3);
          for (v = 0; v < (*pCut & 0x1f); v = v + 1) {
            iVar3 = Of_CutVar((int *)pCut,v);
            if (iVar3 == 0) break;
            iVar2 = Of_CutFlag((int *)pCut,v);
            if (iVar2 != 0) {
              Vec_IntPush(p_02,iVar3);
              Vec_BitWriteEntry(p_03,iVar3,Entry);
            }
          }
          Vec_IntAddToEntry(p_02,uVar5,~uVar5 + p_02->nSize);
          Vec_IntAddToEntry(p_02,0,1);
        }
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Of_ManDeriveMapping( Of_Man_t * p )
{
    Vec_Int_t * vMapping, * vPacking = NULL;
    Vec_Bit_t * vPointed; 
    int i, k, iVar, * pCut, Place, Flag;
    assert( !p->pPars->fCutMin && p->pGia->vMapping == NULL );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, Gia_ManObjNum(p->pGia), 0 );
    if ( p->pPars->nFastEdges )
    {
        vPacking = Vec_IntAlloc( 1000 );
        Vec_IntPush( vPacking, 0 );
    }
    vPointed = Vec_BitStart( Gia_ManObjNum(p->pGia) );
    Gia_ManForEachAndId( p->pGia, i )
    {
        if ( !Of_ObjRefNum(p, i) )
            continue;
        assert( !Gia_ObjIsBuf(Gia_ManObj(p->pGia,i)) );
        pCut = Of_ObjCutBestP( p, i );
        Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
        Vec_IntPush( vMapping, Of_CutSize(pCut) );
        Of_CutForEachVar( pCut, iVar, k )
            Vec_IntPush( vMapping, iVar );
        Vec_IntPush( vMapping, i );
        if ( vPacking == NULL || Vec_BitEntry(vPointed, i) )
            continue;
        Place = Vec_IntSize( vPacking );
        Vec_IntPush( vPacking, 0 );
        Vec_IntPush( vPacking, i );
        Of_CutForEachVarFlag( pCut, iVar, Flag, k )
            if ( Flag )
            {
                Vec_IntPush( vPacking, iVar );
                Vec_BitWriteEntry( vPointed, iVar, 1 );
            }
        Vec_IntAddToEntry( vPacking, Place, Vec_IntSize(vPacking)-Place-1 );
        Vec_IntAddToEntry( vPacking, 0, 1 );
    }
    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vMapping = vMapping;
    p->pGia->vPacking = vPacking;
    Vec_BitFree( vPointed );
    return p->pGia;
}